

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.H
# Opt level: O1

void __thiscall Fl_Window::fullscreen_off(Fl_Window *this,int X,int Y,int W,int H)

{
  byte *pbVar1;
  
  if ((this->i == (Fl_X *)0x0) || (((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x40000) == 0))
  {
    pbVar1 = (byte *)((long)&(this->super_Fl_Group).super_Fl_Widget.flags_ + 2);
    *pbVar1 = *pbVar1 & 0xfb;
  }
  else {
    fullscreen_off_x(this,X,Y,W,H);
  }
  no_fullscreen_h = 0;
  no_fullscreen_w = 0;
  no_fullscreen_y = 0;
  no_fullscreen_x = 0;
  return;
}

Assistant:

int shown() {return i != 0;}